

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float32 float128_to_float32_sparc64(float128 a,float_status *status)

{
  commonNaNT a_00;
  float32 fVar1;
  uint32_t zSig;
  ulong uVar2;
  uint uVar3;
  int zExp;
  commonNaNT local_28;
  
  uVar3 = a.high._6_2_ & 0x7fff;
  if (uVar3 != 0x7fff) {
    uVar2 = (ulong)(((undefined1  [16])a & (undefined1  [16])0x3ffff) != (undefined1  [16])0x0 ||
                   a.low != 0) | (a.high & 0xffffffffffff) >> 0x12;
    zSig = (uint)uVar2 | 0x40000000;
    zExp = uVar3 - 0x3f81;
    if (uVar2 == 0 &&
        ((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      zExp = 0;
      zSig = 0;
    }
    fVar1 = roundAndPackFloat32(a.high._7_1_ >> 7,zExp,zSig,status);
    return fVar1;
  }
  if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
      a.low == 0) {
    fVar1 = a.high._4_4_ & 0x80000000 | 0x7f800000;
  }
  else {
    float128ToCommonNaN(&local_28,a,status);
    a_00.high = local_28.high;
    a_00.sign = local_28.sign;
    a_00._1_7_ = local_28._1_7_;
    a_00.low = local_28.low;
    fVar1 = commonNaNToFloat32(a_00,status);
  }
  return fVar1;
}

Assistant:

float32 float128_to_float32(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig0, aSig1;
    uint32_t zSig;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( aExp == 0x7FFF ) {
        if ( aSig0 | aSig1 ) {
            return commonNaNToFloat32(float128ToCommonNaN(a, status), status);
        }
        return packFloat32( aSign, 0xFF, 0 );
    }
    aSig0 |= ( aSig1 != 0 );
    shift64RightJamming( aSig0, 18, &aSig0 );
    zSig = aSig0;
    if ( aExp || zSig ) {
        zSig |= 0x40000000;
        aExp -= 0x3F81;
    }
    return roundAndPackFloat32(aSign, aExp, zSig, status);

}